

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

Node * __thiscall State::GetNode(State *this,StringPiece path,uint64_t slash_bits)

{
  Node *pNVar1;
  mapped_type *ppNVar2;
  key_type local_50;
  char local_40;
  undefined7 uStack_3f;
  
  pNVar1 = LookupNode(this,path);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = (Node *)operator_new(0x60);
    local_50.str_ = &local_40;
    if (path.len_ == 0) {
      local_50.len_ = 0;
      local_40 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,path.str_,path.str_ + path.len_);
    }
    (pNVar1->path_)._M_dataplus._M_p = (pointer)&(pNVar1->path_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pNVar1,local_50.str_,local_50.str_ + local_50.len_);
    pNVar1->slash_bits_ = slash_bits;
    pNVar1->mtime_ = -1;
    pNVar1->dirty_ = false;
    pNVar1->dyndep_pending_ = false;
    pNVar1->in_edge_ = (Edge *)0x0;
    (pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar1->id_ = -1;
    if (local_50.str_ != &local_40) {
      operator_delete(local_50.str_,CONCAT71(uStack_3f,local_40) + 1);
    }
    local_50.str_ = (pNVar1->path_)._M_dataplus._M_p;
    local_50.len_ = (pNVar1->path_)._M_string_length;
    ppNVar2 = std::__detail::
              _Map_base<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,&local_50);
    *ppNVar2 = pNVar1;
  }
  return pNVar1;
}

Assistant:

Node* State::GetNode(StringPiece path, uint64_t slash_bits) {
  Node* node = LookupNode(path);
  if (node)
    return node;
  node = new Node(path.AsString(), slash_bits);
  paths_[node->path()] = node;
  return node;
}